

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

Vec_Ptr_t * Ptr_AbcDeriveBoxes(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *vBoxes;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkBoxNum(pNtk);
  iVar2 = Abc_NtkNodeNum(pNtk);
  p = Vec_PtrAllocExact(iVar1 + iVar2);
  for (vBoxes._4_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), vBoxes._4_4_ < iVar1;
      vBoxes._4_4_ = vBoxes._4_4_ + 1) {
    pAVar3 = Abc_NtkBox(pNtk,vBoxes._4_4_);
    pVVar4 = Ptr_AbcDeriveBox(pAVar3);
    Vec_PtrPush(p,pVVar4);
  }
  for (vBoxes._4_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), vBoxes._4_4_ < iVar1;
      vBoxes._4_4_ = vBoxes._4_4_ + 1) {
    pAVar3 = Abc_NtkObj(pNtk,vBoxes._4_4_);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar3), iVar1 != 0)) {
      pVVar4 = Ptr_AbcDeriveNode(pAVar3);
      Vec_PtrPush(p,pVVar4);
    }
  }
  iVar1 = Ptr_CheckArray(p);
  if (iVar1 != 0) {
    return p;
  }
  __assert_fail("Ptr_CheckArray(vBoxes)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                ,0xa1,"Vec_Ptr_t *Ptr_AbcDeriveBoxes(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveBoxes( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; int i;
    Vec_Ptr_t * vBoxes = Vec_PtrAllocExact( Abc_NtkBoxNum(pNtk) + Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Vec_PtrPush( vBoxes, Ptr_AbcDeriveBox(pObj) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        Vec_PtrPush( vBoxes, Ptr_AbcDeriveNode(pObj) );
    assert( Ptr_CheckArray(vBoxes) );
    return vBoxes;
}